

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QGraphicsItem_*>::growAppend
          (QCommonArrayOps<QGraphicsItem_*> *this,QGraphicsItem **b,QGraphicsItem **e)

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<QGraphicsItem_*> *old_00;
  QGraphicsItem **in_RDX;
  QGraphicsItem **in_RSI;
  QPodArrayOps<QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<QGraphicsItem_*> *c;
  GrowthPosition where;
  QArrayDataPointer<QGraphicsItem_*> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    old_00 = (QArrayDataPointer<QGraphicsItem_*> *)((long)in_RDX - (long)in_RSI >> 3);
    c = (QCommonArrayOps<QGraphicsItem_*> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QArrayDataPointer<QGraphicsItem_*> *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QGraphicsItem_*>::QArrayDataPointer
              ((QArrayDataPointer<QGraphicsItem_*> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<QGraphicsItem*>,QGraphicsItem*const*>
                      ((QGraphicsItem ***)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<QGraphicsItem_*>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(QGraphicsItem ***)in_RDX,old_00);
    }
    else {
      QArrayDataPointer<QGraphicsItem_*>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(QGraphicsItem ***)in_RDX,old_00);
    }
    QPodArrayOps<QGraphicsItem_*>::copyAppend(in_RDI,in_RDX,(QGraphicsItem **)old_00);
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(old_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }